

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int id;
  int len;
  char vstr [16];
  int local_50;
  int local_4c;
  char local_48 [24];
  
  clear(this);
  local_50 = 0;
  iVar2 = (*dr->_vptr_DataReader[2])(dr,"%d=");
  do {
    if (iVar2 != 1) {
      return 0;
    }
    if (local_50 < -0x5b03) {
      local_50 = -0x5b04 - local_50;
      local_4c = 0;
      iVar2 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_4c);
      if (iVar2 != 1) {
        load_param();
        return -1;
      }
      Mat::create(&this->params[local_50].v,local_4c,4,(Allocator *)0x0);
      if (0 < local_4c) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          iVar2 = (*dr->_vptr_DataReader[2])(dr,",%15[^,\n ]",local_48);
          if (iVar2 != 1) {
            load_param();
            return -1;
          }
          bVar1 = vstr_is_float(local_48);
          if (bVar1) {
            pcVar4 = "%f";
          }
          else {
            pcVar4 = "%d";
          }
          iVar2 = __isoc99_sscanf(local_48,pcVar4,(long)this->params[local_50].v.data + lVar5);
          if (iVar2 != 1) {
            load_param();
            return -1;
          }
          this->params[local_50].type = bVar1 + 5;
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 4;
        } while (lVar3 < local_4c);
      }
    }
    else {
      iVar2 = (*dr->_vptr_DataReader[2])(dr,"%15s",local_48);
      if (iVar2 != 1) {
        load_param();
        return -1;
      }
      bVar1 = vstr_is_float(local_48);
      pcVar4 = "%d";
      if (bVar1) {
        pcVar4 = "%f";
      }
      iVar2 = __isoc99_sscanf(local_48,pcVar4,&this->params[local_50].field_1);
      if (iVar2 != 1) {
        load_param();
        return -1;
      }
      this->params[local_50].type = bVar1 | 2;
    }
    iVar2 = (*dr->_vptr_DataReader[2])(dr,"%d=",&local_50);
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length failed\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element failed\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element failed\n");
                    return -1;
                }

                params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value failed\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value failed\n");
                return -1;
            }

            params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}